

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O3

int volume_control_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint32_t samples;
  float *out;
  float *in;
  uint local_3c;
  float *local_38;
  float *local_30;
  undefined1 local_28 [16];
  
  puVar2 = (undefined8 *)segment->data;
  fVar1 = *(float *)(puVar2 + 4);
  local_28 = ZEXT416(*(uint *)((long)puVar2 + 0x24));
  mixed_buffer_request_read(&local_30,&local_3c,(mixed_buffer *)*puVar2);
  mixed_buffer_request_write(&local_38,&local_3c,(mixed_buffer *)puVar2[2]);
  if ((ulong)local_3c != 0) {
    uVar3 = 0;
    do {
      local_38[uVar3] =
           local_30[uVar3] *
           (float)(~-(uint)(0.0 < (float)local_28._0_4_) & 0x3f800000 |
                  (uint)(1.0 - (float)local_28._0_4_) & -(uint)(0.0 < (float)local_28._0_4_)) *
           fVar1;
      uVar3 = uVar3 + 1;
    } while (local_3c != uVar3);
  }
  mixed_buffer_finish_read(local_3c,(mixed_buffer *)*puVar2);
  mixed_buffer_finish_write(local_3c,(mixed_buffer *)puVar2[2]);
  mixed_buffer_request_read(&local_30,&local_3c,(mixed_buffer *)puVar2[1]);
  mixed_buffer_request_write(&local_38,&local_3c,(mixed_buffer *)puVar2[3]);
  if ((ulong)local_3c != 0) {
    uVar3 = 0;
    do {
      local_38[uVar3] =
           local_30[uVar3] *
           fVar1 * (float)(~-(uint)((float)local_28._0_4_ < 0.0) & 0x3f800000 |
                          (uint)((float)local_28._0_4_ + 1.0) & -(uint)((float)local_28._0_4_ < 0.0)
                          );
      uVar3 = uVar3 + 1;
    } while (local_3c != uVar3);
  }
  mixed_buffer_finish_read(local_3c,(mixed_buffer *)puVar2[1]);
  mixed_buffer_finish_write(local_3c,(mixed_buffer *)puVar2[3]);
  return 1;
}

Assistant:

int volume_control_segment_mix(struct mixed_segment *segment){
  struct volume_control_segment_data *data = (struct volume_control_segment_data *)segment->data;
  float lvolume = data->volume * ((0.0<data->pan)?(1.0f-data->pan):1.0f);
  float rvolume = data->volume * ((data->pan<0.0)?(1.0f+data->pan):1.0f);
  float *restrict in, *restrict out;
  uint32_t samples;

  mixed_buffer_request_read(&in, &samples, data->in[MIXED_LEFT]);
  mixed_buffer_request_write(&out, &samples, data->out[MIXED_LEFT]);
  for(uint32_t i=0; i<samples; ++i)
    out[i] = in[i]*lvolume;
  mixed_buffer_finish_read(samples, data->in[MIXED_LEFT]);
  mixed_buffer_finish_write(samples, data->out[MIXED_LEFT]);
  
  mixed_buffer_request_read(&in, &samples, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&out, &samples, data->out[MIXED_RIGHT]);
  for(uint32_t i=0; i<samples; ++i)
    out[i] = in[i]*rvolume;
  mixed_buffer_finish_read(samples, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(samples, data->out[MIXED_RIGHT]);
  return 1;
}